

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxCaseStatement::Resolve(FxCaseStatement *this,FCompileContext *ctx)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  FxIntCast *this_00;
  undefined4 extraout_var_00;
  undefined1 local_58 [20];
  undefined1 local_44 [4];
  undefined1 local_40 [40];
  FCompileContext *ctx_local;
  FxCaseStatement *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    local_40._32_8_ = ctx;
    ctx_local = (FCompileContext *)this;
    if (this->Condition != (FxExpression *)0x0) {
      if (this->Condition != (FxExpression *)0x0) {
        iVar1 = (*this->Condition->_vptr_FxExpression[2])();
        this->Condition = (FxExpression *)CONCAT44(extraout_var,iVar1);
      }
      if (this->Condition == (FxExpression *)0x0) {
        if (this != (FxCaseStatement *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
    }
    if (this->Condition != (FxExpression *)0x0) {
      uVar2 = (*this->Condition->_vptr_FxExpression[3])();
      if ((uVar2 & 1) == 0) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Case label must be a constant value");
        if (this != (FxCaseStatement *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxCaseStatement *)0x0;
      }
      else if (this->Condition->ValueType == (PType *)TypeName) {
        FxConstant::GetValue((FxConstant *)local_58);
        ExpVal::GetName((ExpVal *)local_44);
        iVar1 = FName::operator_cast_to_int((FName *)local_44);
        this->CaseValue = iVar1;
        ExpVal::~ExpVal((ExpVal *)local_58);
      }
      else {
        this_00 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
        FxIntCast::FxIntCast(this_00,this->Condition,false,false);
        this->Condition = (FxExpression *)this_00;
        if (this->Condition != (FxExpression *)0x0) {
          iVar1 = (*this->Condition->_vptr_FxExpression[2])(this->Condition,local_40._32_8_);
          this->Condition = (FxExpression *)CONCAT44(extraout_var_00,iVar1);
        }
        if (this->Condition == (FxExpression *)0x0) {
          if (this != (FxCaseStatement *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxCaseStatement *)0x0;
        }
        else {
          FxConstant::GetValue((FxConstant *)local_40);
          iVar1 = ExpVal::GetInt((ExpVal *)local_40);
          this->CaseValue = iVar1;
          ExpVal::~ExpVal((ExpVal *)local_40);
        }
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxCaseStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Condition, ctx);

	if (Condition != nullptr)
	{
		if (!Condition->isConstant())
		{
			ScriptPosition.Message(MSG_ERROR, "Case label must be a constant value");
			delete this;
			return nullptr;
		}
		// Case labels can be ints or names.
		if (Condition->ValueType != TypeName)
		{
			Condition = new FxIntCast(Condition, false);
			SAFE_RESOLVE(Condition, ctx);
			CaseValue = static_cast<FxConstant *>(Condition)->GetValue().GetInt();
		}
		else
		{
			CaseValue = static_cast<FxConstant *>(Condition)->GetValue().GetName();
		}
	}
	return this;
}